

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::resize
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,int size)

{
  unique_lock<std::mutex> l;
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  defer_destruction;
  unique_lock<std::mutex> local_68;
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  local_58;
  size_traits local_30;
  
  local_58.
  super__Vector_base<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_device = &this->m_mutex;
  local_68._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_68);
  local_68._M_owns = true;
  if (((this->m_size != size) && (this->m_size = size, size < (int)(this->m_files).node_count)) &&
     (this->m_size < (int)(this->m_files).node_count)) {
    do {
      remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)&stack0xffffffffffffffc8,
                    (unique_lock<std::mutex> *)this);
      ::std::
      vector<std::shared_ptr<libtorrent::aux::file_mapping>,std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>>>
      ::emplace_back<std::shared_ptr<libtorrent::aux::file_mapping>>
                ((vector<std::shared_ptr<libtorrent::aux::file_mapping>,std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>>>
                  *)&local_58,(shared_ptr<libtorrent::aux::file_mapping> *)&stack0xffffffffffffffc8)
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30.size_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30.size_);
      }
    } while (this->m_size < (int)(this->m_files).node_count);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_68);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::file_mapping>,_std::allocator<std::shared_ptr<libtorrent::aux::file_mapping>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::resize(int const size)
	{
		// these are destructed _after_ the mutex is released
		std::vector<FileHandle> defer_destruction;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(size > 0);

		if (size == m_size) return;
		m_size = size;
		if (int(m_files.size()) <= m_size) return;

		// close the least recently used files
		while (int(m_files.size()) > m_size)
			defer_destruction.emplace_back(remove_oldest(l));
	}